

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O2

void __thiscall
leveldb::FilterBlockReader::FilterBlockReader
          (FilterBlockReader *this,FilterPolicy *policy,Slice *contents)

{
  long lVar1;
  ulong uVar2;
  char *pcVar3;
  char cVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->policy_ = policy;
  this->data_ = (char *)0x0;
  this->offset_ = (char *)0x0;
  this->num_ = 0;
  this->base_lg_ = 0;
  uVar2 = contents->size_;
  if (4 < uVar2) {
    cVar4 = Slice::operator[](contents,uVar2 - 1);
    this->base_lg_ = (long)cVar4;
    pcVar3 = contents->data_;
    uVar5 = (ulong)*(uint *)(pcVar3 + (uVar2 - 5));
    if (uVar5 <= uVar2 - 5) {
      this->data_ = pcVar3;
      this->offset_ = pcVar3 + uVar5;
      this->num_ = (uVar2 - 5) - uVar5 >> 2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

FilterBlockReader::FilterBlockReader(const FilterPolicy* policy,
                                     const Slice& contents)
    : policy_(policy), data_(nullptr), offset_(nullptr), num_(0), base_lg_(0) {
  size_t n = contents.size();
  if (n < 5) return;  // 1 byte for base_lg_ and 4 for start of offset array
  base_lg_ = contents[n - 1];
  uint32_t last_word = DecodeFixed32(contents.data() + n - 5);
  if (last_word > n - 5) return;
  data_ = contents.data();
  offset_ = data_ + last_word;
  num_ = (n - 5 - last_word) / 4;
}